

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

PsbtMapDataStruct * __thiscall cfd::api::json::PsbtMapData::ConvertToStruct(PsbtMapData *this)

{
  PsbtMapDataStruct *in_RSI;
  PsbtMapDataStruct *in_RDI;
  PsbtMapDataStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  PsbtMapDataStruct *this_00;
  
  this_00 = in_RDI;
  PsbtMapDataStruct::PsbtMapDataStruct(in_RSI);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&in_RSI->field_0x38);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->value,
             (string *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

PsbtMapDataStruct PsbtMapData::ConvertToStruct() const {  // NOLINT
  PsbtMapDataStruct result;
  result.key = key_;
  result.value = value_;
  result.ignore_items = ignore_items;
  return result;
}